

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StandardFile.cpp
# Opt level: O0

size_t __thiscall Diligent::StandardFile::GetPos(StandardFile *this)

{
  Char *Message;
  undefined1 local_38 [8];
  string msg;
  StandardFile *this_local;
  
  msg.field_2._8_8_ = this;
  if (this->m_pFile == (FILE *)0x0) {
    FormatString<char[19]>((string *)local_38,(char (*) [19])"File is not opened");
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"GetPos",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Platforms/Basic/src/StandardFile.cpp"
               ,100);
    std::__cxx11::string::~string((string *)local_38);
  }
  if (this->m_pFile == (FILE *)0x0) {
    this_local = (StandardFile *)0x0;
  }
  else {
    this_local = (StandardFile *)ftell((FILE *)this->m_pFile);
  }
  return (size_t)this_local;
}

Assistant:

size_t StandardFile::GetPos()
{
    VERIFY(m_pFile, "File is not opened");
    if (!m_pFile)
        return 0;

    return ftell(m_pFile);
}